

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O3

void __thiscall Imf_3_4::StdIFStream::StdIFStream(StdIFStream *this,char *fileName)

{
  ifstream *this_00;
  char *local_48;
  path local_40;
  
  IStream::IStream(&this->super_IStream,fileName);
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__StdIFStream_001e40f8;
  local_48 = fileName;
  this_00 = (ifstream *)operator_new(0x208);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_40,&local_48,auto_format);
  std::ifstream::ifstream(this_00,local_40._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
  std::filesystem::__cxx11::path::~path(&local_40);
  this->_is = (ifstream *)this_00;
  this->_deleteStream = true;
  if (((byte)this_00[*(long *)(*(long *)this_00 + -0x18) + 0x20] & 5) != 0) {
    (**(code **)(*(long *)this_00 + 8))(this_00);
    Iex_3_4::throwErrnoExc();
  }
  return;
}

Assistant:

StdIFStream::StdIFStream (const char fileName[])
    : OPENEXR_IMF_INTERNAL_NAMESPACE::IStream (fileName)
    , _is (make_ifstream (fileName))
    , _deleteStream (true)
{
    if (!*_is)
    {
        delete _is;
        IEX_NAMESPACE::throwErrnoExc ();
    }
}